

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

void __thiscall FIX::DataDictionary::readFromDocument(DataDictionary *this,DOMDocumentPtr *pDoc)

{
  DOMNode *pDVar1;
  long *plVar2;
  _Alloc_hider _Var3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Type type_00;
  int iVar8;
  ConfigError *pCVar9;
  DOMDocument *pDVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pDoc_00;
  string name;
  DOMNode *local_188;
  long *local_180;
  string number;
  string type_1;
  string description;
  long *local_118;
  string enumeration;
  long *local_f0;
  DOMDocumentPtr *local_e8;
  long *local_e0;
  allocator<char> local_d1;
  long *local_d0;
  long *local_c8 [4];
  string type;
  string major;
  long *local_68;
  long *local_60;
  string minor;
  
  pDVar10 = (pDoc->_M_t).
            super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
            super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
            super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  local_e8 = pDoc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"/fix",(allocator<char> *)&major);
  (*pDVar10->_vptr_DOMDocument[5])(&local_60,pDVar10,&type);
  std::__cxx11::string::~string((string *)&type);
  if (local_60 == (long *)0x0) {
    pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,
               "Could not parse data dictionary file, or no <fix> node found at root",
               (allocator<char> *)&major);
    ConfigError::ConfigError(pCVar9,&type);
    __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
  }
  (**(code **)(*local_60 + 0x20))(&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"FIX",(allocator<char> *)&major);
  plVar2 = local_d0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&major,"type",(allocator<char> *)&minor);
  cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&major,&type);
  std::__cxx11::string::~string((string *)&major);
  if (((cVar4 != '\0') && (bVar5 = std::operator!=(&type,"FIX"), bVar5)) &&
     (bVar5 = std::operator!=(&type,"FIXT"), bVar5)) {
    pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&major,"type attribute must be FIX or FIXT",(allocator<char> *)&minor);
    ConfigError::ConfigError(pCVar9,&major);
    __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
  }
  plVar2 = local_d0;
  major._M_dataplus._M_p = (pointer)&major.field_2;
  major._M_string_length = 0;
  major.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&minor,"major",(allocator<char> *)&name);
  cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&minor,&major);
  std::__cxx11::string::~string((string *)&minor);
  plVar2 = local_d0;
  if (cVar4 == '\0') {
    pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minor,"major attribute not found on <fix>",(allocator<char> *)&name);
    ConfigError::ConfigError(pCVar9,&minor);
    __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
  }
  minor._M_dataplus._M_p = (pointer)&minor.field_2;
  minor._M_string_length = 0;
  minor.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"minor",(allocator<char> *)&number);
  cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&name,&minor);
  std::__cxx11::string::~string((string *)&name);
  if (cVar4 == '\0') {
    pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"minor attribute not found on <fix>",(allocator<char> *)&number);
    ConfigError::ConfigError(pCVar9,&name);
    __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
  }
  std::operator+(&enumeration,&type,".");
  std::operator+(&type_1,&enumeration,&major);
  std::operator+(&number,&type_1,".");
  std::operator+(&name,&number,&minor);
  setVersion(this,&name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&number);
  std::__cxx11::string::~string((string *)&type_1);
  std::__cxx11::string::~string((string *)&enumeration);
  pDVar10 = (local_e8->_M_t).
            super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
            super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
            super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"/fix/fields",(allocator<char> *)&number);
  (*pDVar10->_vptr_DOMDocument[5])(&local_68,pDVar10,&name);
  std::__cxx11::string::~string((string *)&name);
  if (local_68 == (long *)0x0) {
    pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"<fields> section not found in data dictionary",
               (allocator<char> *)&number);
    ConfigError::ConfigError(pCVar9,&name);
    __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
  }
  (**(code **)(*local_68 + 0x10))(&local_f0);
  if (local_f0 == (long *)0x0) {
    pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"No fields defined",(allocator<char> *)&number);
    ConfigError::ConfigError(pCVar9,&name);
    __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
  }
  while (local_f0 != (long *)0x0) {
    (**(code **)(*local_f0 + 0x28))(&name);
    bVar5 = std::operator==(&name,"field");
    std::__cxx11::string::~string((string *)&name);
    if (bVar5) {
      (**(code **)(*local_f0 + 0x20))(&local_180);
      plVar2 = local_180;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&number,"name",(allocator<char> *)&type_1);
      cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&number,&name);
      std::__cxx11::string::~string((string *)&number);
      plVar2 = local_180;
      if (cVar4 == '\0') {
        pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&number,"<field> does not have a name attribute",
                   (allocator<char> *)&type_1);
        ConfigError::ConfigError(pCVar9,&number);
        __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
      }
      number._M_dataplus._M_p = (pointer)&number.field_2;
      number._M_string_length = 0;
      number.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type_1,"number",(allocator<char> *)&enumeration);
      cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&type_1,&number);
      std::__cxx11::string::~string((string *)&type_1);
      if (cVar4 == '\0') {
        pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::operator+(&enumeration,"<field> ",&name);
        std::operator+(&type_1,&enumeration," does not have a number attribute");
        ConfigError::ConfigError(pCVar9,&type_1);
        __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
      }
      iVar7 = atoi(number._M_dataplus._M_p);
      plVar2 = local_180;
      type_1._M_dataplus._M_p = (pointer)&type_1.field_2;
      type_1._M_string_length = 0;
      type_1.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&enumeration,"type",(allocator<char> *)&description);
      cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&enumeration,&type_1);
      std::__cxx11::string::~string((string *)&enumeration);
      if (cVar4 == '\0') {
        pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::operator+(&description,"<field> ",&name);
        std::operator+(&enumeration,&description," does not have a type attribute");
        ConfigError::ConfigError(pCVar9,&enumeration);
        __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
      }
      addField(this,iVar7);
      type_00 = XMLTypeToType(this,&type_1);
      addFieldType(this,iVar7,type_00);
      addFieldName(this,iVar7,&name);
      (**(code **)(*local_f0 + 0x10))(&local_118);
      while (local_118 != (long *)0x0) {
        (**(code **)(*local_118 + 0x28))(&enumeration);
        bVar5 = std::operator==(&enumeration,"value");
        std::__cxx11::string::~string((string *)&enumeration);
        if (bVar5) {
          (**(code **)(*local_118 + 0x20))(&local_188);
          pDVar1 = local_188;
          enumeration._M_dataplus._M_p = (pointer)&enumeration.field_2;
          enumeration._M_string_length = 0;
          enumeration.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&description,"enum",(allocator<char> *)local_c8);
          iVar8 = (*pDVar1->_vptr_DOMNode[2])(pDVar1,&description,&enumeration);
          std::__cxx11::string::~string((string *)&description);
          if ((char)iVar8 == '\0') {
            pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
            std::operator+(&description,"<value> does not have enum attribute in field ",&name);
            ConfigError::ConfigError(pCVar9,&description);
            __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
          }
          addFieldValue(this,iVar7,&enumeration);
          pDVar1 = local_188;
          description._M_dataplus._M_p = (pointer)&description.field_2;
          description._M_string_length = 0;
          description.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_c8,"description",(allocator<char> *)&local_e0);
          iVar8 = (*pDVar1->_vptr_DOMNode[2])(pDVar1,(string *)local_c8,&description);
          std::__cxx11::string::~string((string *)local_c8);
          if ((char)iVar8 != '\0') {
            addValueName(this,iVar7,&enumeration,&description);
          }
          std::__cxx11::string::~string((string *)&description);
          std::__cxx11::string::~string((string *)&enumeration);
          if (local_188 != (DOMNode *)0x0) {
            (*local_188->_vptr_DOMNode[1])();
          }
        }
        (**(code **)(*local_118 + 0x18))(&enumeration);
        _Var3 = enumeration._M_dataplus;
        plVar2 = local_118;
        enumeration._M_dataplus._M_p = (pointer)0x0;
        local_118 = (long *)_Var3._M_p;
        if ((plVar2 != (long *)0x0) &&
           ((**(code **)(*plVar2 + 8))(), enumeration._M_dataplus._M_p != (pointer)0x0)) {
          (**(code **)(*(long *)enumeration._M_dataplus._M_p + 8))();
        }
      }
      std::__cxx11::string::~string((string *)&type_1);
      std::__cxx11::string::~string((string *)&number);
      std::__cxx11::string::~string((string *)&name);
      if (local_180 != (long *)0x0) {
        (**(code **)(*local_180 + 8))();
      }
    }
    (**(code **)(*local_f0 + 0x18))(&name);
    plVar2 = local_f0;
    local_f0 = (long *)name._M_dataplus;
    name._M_dataplus._M_p = (pointer)0x0;
    if ((plVar2 != (long *)0x0) &&
       ((**(code **)(*plVar2 + 8))(), name._M_dataplus._M_p != (pointer)0x0)) {
      (**(code **)(*(long *)name._M_dataplus._M_p + 8))();
    }
  }
  bVar5 = std::operator==(&type,"FIXT");
  if ((bVar5) ||
     ((bVar5 = std::operator==(&type,"FIX"), bVar5 && (bVar5 = std::operator<(&major,"5"), bVar5))))
  {
    pDVar10 = (local_e8->_M_t).
              super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
              super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
              super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"/fix/header",(allocator<char> *)&number);
    (*pDVar10->_vptr_DOMDocument[5])(&enumeration,pDVar10,&name);
    std::__cxx11::string::~string((string *)&name);
    if (enumeration._M_dataplus._M_p == (pointer)0x0) {
      pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"<header> section not found in data dictionary",
                 (allocator<char> *)&number);
      ConfigError::ConfigError(pCVar9,&name);
      __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
    }
    (**(code **)(*(long *)enumeration._M_dataplus._M_p + 0x10))(&description);
    if (description._M_dataplus._M_p == (pointer)0x0) {
      pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"No header fields defined",(allocator<char> *)&number);
      ConfigError::ConfigError(pCVar9,&name);
      __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
    }
    while (description._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)description._M_dataplus._M_p + 0x28))(&name);
      bVar5 = std::operator==(&name,"field");
      if (bVar5) {
        std::__cxx11::string::~string((string *)&name);
LAB_00170e60:
        (**(code **)(*(long *)description._M_dataplus._M_p + 0x20))(local_c8);
        plVar2 = local_c8[0];
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&number,"name",(allocator<char> *)&type_1);
        cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&number,&name);
        std::__cxx11::string::~string((string *)&number);
        plVar2 = local_c8[0];
        if (cVar4 == '\0') {
          pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&number,"<field> does not have a name attribute",
                     (allocator<char> *)&type_1);
          ConfigError::ConfigError(pCVar9,&number);
          __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
        }
        number._M_dataplus._M_p = (pointer)&number.field_2;
        number._M_string_length = 0;
        number.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&type_1,"required",(allocator<char> *)&local_180);
        (**(code **)(*plVar2 + 0x10))(plVar2,&type_1,&number);
        std::__cxx11::string::~string((string *)&type_1);
        pDVar10 = (DOMDocument *)0x1c5886;
        bVar5 = std::operator==(&number,"Y");
        bVar6 = true;
        if (!bVar5) {
          pDVar10 = (DOMDocument *)0x1cf971;
          bVar6 = std::operator==(&number,"y");
        }
        iVar7 = lookupXMLFieldNumber(this,pDVar10,&name);
        addHeaderField(this,iVar7,bVar6);
        std::__cxx11::string::~string((string *)&number);
        std::__cxx11::string::~string((string *)&name);
        if (local_c8[0] != (long *)0x0) {
          (**(code **)(*local_c8[0] + 8))();
        }
      }
      else {
        (**(code **)(*(long *)description._M_dataplus._M_p + 0x28))(&number);
        bVar5 = std::operator==(&number,"group");
        std::__cxx11::string::~string((string *)&number);
        std::__cxx11::string::~string((string *)&name);
        if (bVar5) goto LAB_00170e60;
      }
      (**(code **)(*(long *)description._M_dataplus._M_p + 0x28))(&name);
      bVar5 = std::operator==(&name,"group");
      std::__cxx11::string::~string((string *)&name);
      if (bVar5) {
        (**(code **)(*(long *)description._M_dataplus._M_p + 0x20))(&type_1);
        _Var3 = type_1._M_dataplus;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&number,"required",(allocator<char> *)local_c8);
        (**(code **)(*(long *)_Var3._M_p + 0x10))(_Var3._M_p,&number,&name);
        std::__cxx11::string::~string((string *)&number);
        bVar5 = std::operator==(&name,"Y");
        bVar6 = true;
        if (!bVar5) {
          bVar6 = std::operator==(&name,"y");
        }
        _Var3._M_p = description._M_dataplus._M_p;
        pDVar10 = (local_e8->_M_t).
                  super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                  .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&number,"_header_",(allocator<char> *)local_c8);
        addXMLGroup(this,pDVar10,(DOMNode *)_Var3._M_p,&number,this,bVar6);
        std::__cxx11::string::~string((string *)&number);
        std::__cxx11::string::~string((string *)&name);
        if (type_1._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)type_1._M_dataplus._M_p + 8))();
        }
      }
      (**(code **)(*(long *)description._M_dataplus._M_p + 0x18))(&name);
      _Var3 = description._M_dataplus;
      description._M_dataplus = name._M_dataplus;
      name._M_dataplus._M_p = (pointer)0x0;
      if ((_Var3._M_p != (pointer)0x0) &&
         ((**(code **)(*(long *)_Var3._M_p + 8))(), name._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)name._M_dataplus._M_p + 8))();
      }
    }
    if (enumeration._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)enumeration._M_dataplus._M_p + 8))();
    }
  }
  bVar5 = std::operator==(&type,"FIXT");
  if ((bVar5) ||
     ((bVar5 = std::operator==(&type,"FIX"), bVar5 && (bVar5 = std::operator<(&major,"5"), bVar5))))
  {
    pDVar10 = (local_e8->_M_t).
              super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
              super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
              super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"/fix/trailer",(allocator<char> *)&number);
    (*pDVar10->_vptr_DOMDocument[5])(&enumeration,pDVar10,&name);
    std::__cxx11::string::~string((string *)&name);
    if (enumeration._M_dataplus._M_p == (pointer)0x0) {
      pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"<trailer> section not found in data dictionary",
                 (allocator<char> *)&number);
      ConfigError::ConfigError(pCVar9,&name);
      __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
    }
    (**(code **)(*(long *)enumeration._M_dataplus._M_p + 0x10))(&description);
    if (description._M_dataplus._M_p == (pointer)0x0) {
      pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"No trailer fields defined",(allocator<char> *)&number);
      ConfigError::ConfigError(pCVar9,&name);
      __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
    }
    while (description._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)description._M_dataplus._M_p + 0x28))(&name);
      bVar5 = std::operator==(&name,"field");
      if (bVar5) {
        std::__cxx11::string::~string((string *)&name);
LAB_0017120c:
        (**(code **)(*(long *)description._M_dataplus._M_p + 0x20))(local_c8);
        plVar2 = local_c8[0];
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&number,"name",(allocator<char> *)&type_1);
        cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&number,&name);
        std::__cxx11::string::~string((string *)&number);
        plVar2 = local_c8[0];
        if (cVar4 == '\0') {
          pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&number,"<field> does not have a name attribute",
                     (allocator<char> *)&type_1);
          ConfigError::ConfigError(pCVar9,&number);
          __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
        }
        number._M_dataplus._M_p = (pointer)&number.field_2;
        number._M_string_length = 0;
        number.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&type_1,"required",(allocator<char> *)&local_180);
        (**(code **)(*plVar2 + 0x10))(plVar2,&type_1,&number);
        std::__cxx11::string::~string((string *)&type_1);
        pDVar10 = (DOMDocument *)0x1c5886;
        bVar5 = std::operator==(&number,"Y");
        bVar6 = true;
        if (!bVar5) {
          pDVar10 = (DOMDocument *)0x1cf971;
          bVar6 = std::operator==(&number,"y");
        }
        iVar7 = lookupXMLFieldNumber(this,pDVar10,&name);
        addTrailerField(this,iVar7,bVar6);
        std::__cxx11::string::~string((string *)&number);
        std::__cxx11::string::~string((string *)&name);
        if (local_c8[0] != (long *)0x0) {
          (**(code **)(*local_c8[0] + 8))();
        }
      }
      else {
        (**(code **)(*(long *)description._M_dataplus._M_p + 0x28))(&number);
        bVar5 = std::operator==(&number,"group");
        std::__cxx11::string::~string((string *)&number);
        std::__cxx11::string::~string((string *)&name);
        if (bVar5) goto LAB_0017120c;
      }
      (**(code **)(*(long *)description._M_dataplus._M_p + 0x28))(&name);
      bVar5 = std::operator==(&name,"group");
      std::__cxx11::string::~string((string *)&name);
      if (bVar5) {
        (**(code **)(*(long *)description._M_dataplus._M_p + 0x20))(&type_1);
        _Var3 = type_1._M_dataplus;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&number,"required",(allocator<char> *)local_c8);
        (**(code **)(*(long *)_Var3._M_p + 0x10))(_Var3._M_p,&number,&name);
        std::__cxx11::string::~string((string *)&number);
        bVar5 = std::operator==(&name,"Y");
        bVar6 = true;
        if (!bVar5) {
          bVar6 = std::operator==(&name,"y");
        }
        _Var3._M_p = description._M_dataplus._M_p;
        pDVar10 = (local_e8->_M_t).
                  super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                  .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&number,"_trailer_",(allocator<char> *)local_c8);
        addXMLGroup(this,pDVar10,(DOMNode *)_Var3._M_p,&number,this,bVar6);
        std::__cxx11::string::~string((string *)&number);
        std::__cxx11::string::~string((string *)&name);
        if (type_1._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)type_1._M_dataplus._M_p + 8))();
        }
      }
      (**(code **)(*(long *)description._M_dataplus._M_p + 0x18))(&name);
      _Var3 = description._M_dataplus;
      description._M_dataplus = name._M_dataplus;
      name._M_dataplus._M_p = (pointer)0x0;
      if ((_Var3._M_p != (pointer)0x0) &&
         ((**(code **)(*(long *)_Var3._M_p + 8))(), name._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)name._M_dataplus._M_p + 8))();
      }
    }
    if (enumeration._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)enumeration._M_dataplus._M_p + 8))();
    }
  }
  pDVar10 = (local_e8->_M_t).
            super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
            super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
            super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"/fix/messages",(allocator<char> *)&number);
  (*pDVar10->_vptr_DOMDocument[5])(local_c8,pDVar10,&name);
  std::__cxx11::string::~string((string *)&name);
  if (local_c8[0] == (long *)0x0) {
    pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"<messages> section not found in data dictionary",
               (allocator<char> *)&number);
    ConfigError::ConfigError(pCVar9,&name);
    __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
  }
  (**(code **)(*local_c8[0] + 0x10))(&local_180);
  if (local_180 == (long *)0x0) {
    pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"No messages defined",(allocator<char> *)&number);
    ConfigError::ConfigError(pCVar9,&name);
    __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
  }
  do {
    if (local_180 == (long *)0x0) {
      if (local_c8[0] != (long *)0x0) {
        (**(code **)(*local_c8[0] + 8))();
      }
      if (local_f0 != (long *)0x0) {
        (**(code **)(*local_f0 + 8))();
      }
      if (local_68 != (long *)0x0) {
        (**(code **)(*local_68 + 8))();
      }
      std::__cxx11::string::~string((string *)&minor);
      std::__cxx11::string::~string((string *)&major);
      std::__cxx11::string::~string((string *)&type);
      if (local_d0 != (long *)0x0) {
        (**(code **)(*local_d0 + 8))();
      }
      if (local_60 != (long *)0x0) {
        (**(code **)(*local_60 + 8))();
      }
      return;
    }
    (**(code **)(*local_180 + 0x28))(&name);
    bVar5 = std::operator==(&name,"message");
    std::__cxx11::string::~string((string *)&name);
    if (bVar5) {
      (**(code **)(*local_180 + 0x20))(&local_118);
      plVar2 = local_118;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&number,"msgtype",(allocator<char> *)&type_1);
      cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&number,&name);
      std::__cxx11::string::~string((string *)&number);
      if (cVar4 == '\0') {
        pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&number,"<message> does not have a msgtype attribute",
                   (allocator<char> *)&type_1);
        ConfigError::ConfigError(pCVar9,&number);
        __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_messages,&name);
      plVar2 = local_118;
      number._M_dataplus._M_p = (pointer)&number.field_2;
      number._M_string_length = 0;
      number.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type_1,"name",(allocator<char> *)&enumeration);
      cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&type_1,&number);
      std::__cxx11::string::~string((string *)&type_1);
      if (cVar4 != '\0') {
        addValueName(this,0x23,&name,&number);
      }
      (**(code **)(*local_180 + 0x10))(&local_188);
      while( true ) {
        if (local_188 == (DOMNode *)0x0) break;
        (*local_188->_vptr_DOMNode[5])(&type_1);
        bVar5 = std::operator==(&type_1,"field");
        if (bVar5) {
          std::__cxx11::string::~string((string *)&type_1);
LAB_001716ce:
          (*local_188->_vptr_DOMNode[4])(&local_e0);
          plVar2 = local_e0;
          type_1._M_dataplus._M_p = (pointer)&type_1.field_2;
          type_1._M_string_length = 0;
          type_1.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&enumeration,"name",(allocator<char> *)&description);
          pDoc_00 = &enumeration;
          cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&enumeration,&type_1);
          std::__cxx11::string::~string((string *)&enumeration);
          if (cVar4 == '\0') {
            pCVar9 = (ConfigError *)__cxa_allocate_exception(0x50);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&enumeration,"<field> does not have a name attribute",
                       (allocator<char> *)&description);
            ConfigError::ConfigError(pCVar9,&enumeration);
            __cxa_throw(pCVar9,&ConfigError::typeinfo,Exception::~Exception);
          }
          iVar7 = lookupXMLFieldNumber(this,(DOMDocument *)pDoc_00,&type_1);
          addMsgField(this,&name,iVar7);
          plVar2 = local_e0;
          enumeration._M_dataplus._M_p = (pointer)&enumeration.field_2;
          enumeration._M_string_length = 0;
          enumeration.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&description,"required",&local_d1);
          cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,&description,&enumeration);
          if (cVar4 == '\0') {
            std::__cxx11::string::~string((string *)&description);
          }
          else {
            bVar5 = std::operator==(&enumeration,"Y");
            if (bVar5) {
              std::__cxx11::string::~string((string *)&description);
            }
            else {
              bVar5 = std::operator==(&enumeration,"y");
              std::__cxx11::string::~string((string *)&description);
              if (!bVar5) goto LAB_0017192c;
            }
            addRequiredField(this,&name,iVar7);
          }
LAB_0017192c:
          std::__cxx11::string::~string((string *)&enumeration);
          std::__cxx11::string::~string((string *)&type_1);
          if (local_e0 != (long *)0x0) {
            (**(code **)(*local_e0 + 8))();
          }
        }
        else {
          (*local_188->_vptr_DOMNode[5])(&enumeration);
          bVar5 = std::operator==(&enumeration,"group");
          std::__cxx11::string::~string((string *)&enumeration);
          std::__cxx11::string::~string((string *)&type_1);
          if (bVar5) goto LAB_001716ce;
          (*local_188->_vptr_DOMNode[5])(&type_1);
          bVar5 = std::operator==(&type_1,"component");
          std::__cxx11::string::~string((string *)&type_1);
          if (bVar5) {
            (*local_188->_vptr_DOMNode[4])(&description);
            _Var3 = description._M_dataplus;
            type_1._M_dataplus._M_p = (pointer)&type_1.field_2;
            type_1._M_string_length = 0;
            type_1.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&enumeration,"required",(allocator<char> *)&local_e0);
            (**(code **)(*(long *)_Var3._M_p + 0x10))(_Var3._M_p,&enumeration,&type_1);
            std::__cxx11::string::~string((string *)&enumeration);
            bVar5 = std::operator==(&type_1,"Y");
            bVar6 = true;
            if (!bVar5) {
              bVar6 = std::operator==(&type_1,"y");
            }
            addXMLComponentFields
                      (this,(local_e8->_M_t).
                            super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                            .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,local_188
                       ,&name,this,bVar6);
            std::__cxx11::string::~string((string *)&type_1);
            if (description._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)description._M_dataplus._M_p + 8))();
            }
          }
        }
        (*local_188->_vptr_DOMNode[5])(&type_1);
        bVar5 = std::operator==(&type_1,"group");
        std::__cxx11::string::~string((string *)&type_1);
        if (bVar5) {
          (*local_188->_vptr_DOMNode[4])(&description);
          _Var3 = description._M_dataplus;
          type_1._M_dataplus._M_p = (pointer)&type_1.field_2;
          type_1._M_string_length = 0;
          type_1.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&enumeration,"required",(allocator<char> *)&local_e0);
          (**(code **)(*(long *)_Var3._M_p + 0x10))(_Var3._M_p,&enumeration,&type_1);
          std::__cxx11::string::~string((string *)&enumeration);
          bVar5 = std::operator==(&type_1,"Y");
          bVar6 = true;
          if (!bVar5) {
            bVar6 = std::operator==(&type_1,"y");
          }
          addXMLGroup(this,(local_e8->_M_t).
                           super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                           .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,local_188,
                      &name,this,bVar6);
          std::__cxx11::string::~string((string *)&type_1);
          if (description._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)description._M_dataplus._M_p + 8))();
          }
        }
        (*local_188->_vptr_DOMNode[3])(&type_1);
        _Var3 = type_1._M_dataplus;
        pDVar1 = local_188;
        local_188 = (DOMNode *)type_1._M_dataplus._M_p;
        type_1._M_dataplus._M_p = (pointer)0x0;
        if ((pDVar1 != (DOMNode *)0x0) &&
           ((*pDVar1->_vptr_DOMNode[1])(), type_1._M_dataplus._M_p != (pointer)0x0)) {
          (**(code **)(*(long *)type_1._M_dataplus._M_p + 8))();
        }
      }
      std::__cxx11::string::~string((string *)&number);
      std::__cxx11::string::~string((string *)&name);
      if (local_118 != (long *)0x0) {
        (**(code **)(*local_118 + 8))();
      }
    }
    (**(code **)(*local_180 + 0x18))(&name);
    plVar2 = local_180;
    local_180 = (long *)name._M_dataplus;
    name._M_dataplus._M_p = (pointer)0x0;
    if ((plVar2 != (long *)0x0) &&
       ((**(code **)(*plVar2 + 8))(), name._M_dataplus._M_p != (pointer)0x0)) {
      (**(code **)(*(long *)name._M_dataplus._M_p + 8))();
    }
  } while( true );
}

Assistant:

EXCEPT(ConfigError) {
  // VERSION
  DOMNodePtr pFixNode = pDoc->getNode("/fix");
  if (!pFixNode.get()) {
    throw ConfigError("Could not parse data dictionary file"
                      ", or no <fix> node found at root");
  }
  DOMAttributesPtr attrs = pFixNode->getAttributes();
  std::string type = "FIX";
  if (attrs->get("type", type)) {
    if (type != "FIX" && type != "FIXT") {
      throw ConfigError("type attribute must be FIX or FIXT");
    }
  }
  std::string major;
  if (!attrs->get("major", major)) {
    throw ConfigError("major attribute not found on <fix>");
  }
  std::string minor;
  if (!attrs->get("minor", minor)) {
    throw ConfigError("minor attribute not found on <fix>");
  }
  setVersion(type + "." + major + "." + minor);

  // FIELDS
  DOMNodePtr pFieldsNode = pDoc->getNode("/fix/fields");
  if (!pFieldsNode.get()) {
    throw ConfigError("<fields> section not found in data dictionary");
  }

  DOMNodePtr pFieldNode = pFieldsNode->getFirstChildNode();
  if (!pFieldNode.get()) {
    throw ConfigError("No fields defined");
  }

  while (pFieldNode.get()) {
    if (pFieldNode->getName() == "field") {
      DOMAttributesPtr attrs = pFieldNode->getAttributes();
      std::string name;
      if (!attrs->get("name", name)) {
        throw ConfigError("<field> does not have a name attribute");
      }
      std::string number;
      if (!attrs->get("number", number)) {
        throw ConfigError("<field> " + name + " does not have a number attribute");
      }
      int num = atoi(number.c_str());
      std::string type;
      if (!attrs->get("type", type)) {
        throw ConfigError("<field> " + name + " does not have a type attribute");
      }
      addField(num);
      addFieldType(num, XMLTypeToType(type));
      addFieldName(num, name);

      DOMNodePtr pFieldValueNode = pFieldNode->getFirstChildNode();
      while (pFieldValueNode.get()) {
        if (pFieldValueNode->getName() == "value") {
          DOMAttributesPtr attrs = pFieldValueNode->getAttributes();
          std::string enumeration;
          if (!attrs->get("enum", enumeration)) {
            throw ConfigError("<value> does not have enum attribute in field " + name);
          }
          addFieldValue(num, enumeration);
          std::string description;
          if (attrs->get("description", description)) {
            addValueName(num, enumeration, description);
          }
        }
        RESET_AUTO_PTR(pFieldValueNode, pFieldValueNode->getNextSiblingNode());
      }
    }
    RESET_AUTO_PTR(pFieldNode, pFieldNode->getNextSiblingNode());
  }

  // HEADER
  if (type == "FIXT" || (type == "FIX" && major < "5")) {
    DOMNodePtr pHeaderNode = pDoc->getNode("/fix/header");
    if (!pHeaderNode.get()) {
      throw ConfigError("<header> section not found in data dictionary");
    }

    DOMNodePtr pHeaderFieldNode = pHeaderNode->getFirstChildNode();
    if (!pHeaderFieldNode.get()) {
      throw ConfigError("No header fields defined");
    }

    while (pHeaderFieldNode.get()) {
      if (pHeaderFieldNode->getName() == "field" || pHeaderFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pHeaderFieldNode->getAttributes();
        std::string name;
        if (!attrs->get("name", name)) {
          throw ConfigError("<field> does not have a name attribute");
        }
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addHeaderField(lookupXMLFieldNumber(pDoc.get(), name), isRequired);
      }
      if (pHeaderFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pHeaderFieldNode->getAttributes();
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addXMLGroup(pDoc.get(), pHeaderFieldNode.get(), "_header_", *this, isRequired);
      }

      RESET_AUTO_PTR(pHeaderFieldNode, pHeaderFieldNode->getNextSiblingNode());
    }
  }

  // TRAILER
  if (type == "FIXT" || (type == "FIX" && major < "5")) {
    DOMNodePtr pTrailerNode = pDoc->getNode("/fix/trailer");
    if (!pTrailerNode.get()) {
      throw ConfigError("<trailer> section not found in data dictionary");
    }

    DOMNodePtr pTrailerFieldNode = pTrailerNode->getFirstChildNode();
    if (!pTrailerFieldNode.get()) {
      throw ConfigError("No trailer fields defined");
    }

    while (pTrailerFieldNode.get()) {
      if (pTrailerFieldNode->getName() == "field" || pTrailerFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pTrailerFieldNode->getAttributes();
        std::string name;
        if (!attrs->get("name", name)) {
          throw ConfigError("<field> does not have a name attribute");
        }
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addTrailerField(lookupXMLFieldNumber(pDoc.get(), name), isRequired);
      }
      if (pTrailerFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pTrailerFieldNode->getAttributes();
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addXMLGroup(pDoc.get(), pTrailerFieldNode.get(), "_trailer_", *this, isRequired);
      }

      RESET_AUTO_PTR(pTrailerFieldNode, pTrailerFieldNode->getNextSiblingNode());
    }
  }

  // MSGTYPE
  DOMNodePtr pMessagesNode = pDoc->getNode("/fix/messages");
  if (!pMessagesNode.get()) {
    throw ConfigError("<messages> section not found in data dictionary");
  }

  DOMNodePtr pMessageNode = pMessagesNode->getFirstChildNode();
  if (!pMessageNode.get()) {
    throw ConfigError("No messages defined");
  }

  while (pMessageNode.get()) {
    if (pMessageNode->getName() == "message") {
      DOMAttributesPtr attrs = pMessageNode->getAttributes();
      std::string msgtype;
      if (!attrs->get("msgtype", msgtype)) {
        throw ConfigError("<message> does not have a msgtype attribute");
      }
      addMsgType(msgtype);

      std::string name;
      if (attrs->get("name", name)) {
        addValueName(35, msgtype, name);
      }

      DOMNodePtr pMessageFieldNode = pMessageNode->getFirstChildNode();
      while (pMessageFieldNode.get()) {
        if (pMessageFieldNode->getName() == "field" || pMessageFieldNode->getName() == "group") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string name;
          if (!attrs->get("name", name)) {
            throw ConfigError("<field> does not have a name attribute");
          }
          int num = lookupXMLFieldNumber(pDoc.get(), name);
          addMsgField(msgtype, num);

          std::string required;
          if (attrs->get("required", required) && (required == "Y" || required == "y")) {
            addRequiredField(msgtype, num);
          }
        } else if (pMessageFieldNode->getName() == "component") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string required;
          attrs->get("required", required);
          bool isRequired = (required == "Y" || required == "y");
          addXMLComponentFields(pDoc.get(), pMessageFieldNode.get(), msgtype, *this, isRequired);
        }
        if (pMessageFieldNode->getName() == "group") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string required;
          attrs->get("required", required);
          bool isRequired = (required == "Y" || required == "y");
          addXMLGroup(pDoc.get(), pMessageFieldNode.get(), msgtype, *this, isRequired);
        }
        RESET_AUTO_PTR(pMessageFieldNode, pMessageFieldNode->getNextSiblingNode());
      }
    }
    RESET_AUTO_PTR(pMessageNode, pMessageNode->getNextSiblingNode());
  }
}